

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::InitialPass
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  string subCommand;
  string e;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"must be called with at least two arguments.","");
    cmCommand::SetError(&this->super_cmCommand,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  else {
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,pcVar3 + pbVar2->_M_string_length);
    iVar5 = std::__cxx11::string::compare((char *)&local_68);
    if ((iVar5 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&local_68), iVar6 == 0)) {
      bVar4 = HandleWriteCommand(this,args,iVar5 != 0);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar5 == 0) {
        bVar4 = HandleDownloadCommand(this,args);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar5 == 0) {
          bVar4 = HandleUploadCommand(this,args);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_68);
          if (iVar5 == 0) {
            bVar4 = HandleReadCommand(this,args);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_68);
            if (((((iVar5 == 0) ||
                  (iVar5 = std::__cxx11::string::compare((char *)&local_68), iVar5 == 0)) ||
                 (iVar5 = std::__cxx11::string::compare((char *)&local_68), iVar5 == 0)) ||
                ((iVar5 = std::__cxx11::string::compare((char *)&local_68), iVar5 == 0 ||
                 (iVar5 = std::__cxx11::string::compare((char *)&local_68), iVar5 == 0)))) ||
               (iVar5 = std::__cxx11::string::compare((char *)&local_68), iVar5 == 0)) {
              bVar4 = HandleHashCommand(this,args);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&local_68);
              if (iVar5 == 0) {
                bVar4 = HandleStringsCommand(this,args);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)&local_68);
                if ((iVar5 == 0) ||
                   (iVar6 = std::__cxx11::string::compare((char *)&local_68), iVar6 == 0)) {
                  bVar4 = HandleGlobCommand(this,args,iVar5 != 0);
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)&local_68);
                  if (iVar5 == 0) {
                    bVar4 = HandleMakeDirectoryCommand(this,args);
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)&local_68);
                    if (iVar5 == 0) {
                      bVar4 = HandleRename(this,args);
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)&local_68);
                      if ((iVar5 == 0) ||
                         (iVar6 = std::__cxx11::string::compare((char *)&local_68), iVar6 == 0)) {
                        bVar4 = true;
                        HandleRemove(this,args,iVar5 != 0);
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)&local_68);
                        if (iVar5 == 0) {
                          bVar4 = HandleCopyCommand(this,args);
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)&local_68);
                          if (iVar5 == 0) {
                            bVar4 = HandleInstallCommand(this,args);
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)&local_68);
                            if (iVar5 == 0) {
                              bVar4 = HandleDifferentCommand(this,args);
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)&local_68);
                              if ((iVar5 == 0) ||
                                 (iVar5 = std::__cxx11::string::compare((char *)&local_68),
                                 iVar5 == 0)) {
                                bVar4 = HandleRPathChangeCommand(this,args);
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)&local_68);
                                if (iVar5 == 0) {
                                  bVar4 = HandleRPathCheckCommand(this,args);
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)&local_68);
                                  if (iVar5 == 0) {
                                    bVar4 = HandleRPathRemoveCommand(this,args);
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)&local_68);
                                    if (iVar5 == 0) {
                                      bVar4 = HandleRelativePathCommand(this,args);
                                    }
                                    else {
                                      iVar5 = std::__cxx11::string::compare((char *)&local_68);
                                      if ((iVar5 == 0) ||
                                         (iVar6 = std::__cxx11::string::compare((char *)&local_68),
                                         iVar6 == 0)) {
                                        bVar4 = HandleCMakePathCommand(this,args,iVar5 != 0);
                                      }
                                      else {
                                        iVar5 = std::__cxx11::string::compare((char *)&local_68);
                                        if (iVar5 == 0) {
                                          bVar4 = HandleTimestampCommand(this,args);
                                        }
                                        else {
                                          iVar5 = std::__cxx11::string::compare((char *)&local_68);
                                          if (iVar5 == 0) {
                                            bVar4 = HandleGenerateCommand(this,args);
                                          }
                                          else {
                                            iVar5 = std::__cxx11::string::compare((char *)&local_68)
                                            ;
                                            if (iVar5 == 0) {
                                              bVar4 = HandleLockCommand(this,args);
                                            }
                                            else {
                                              std::operator+(&local_48,
                                                             "does not recognize sub-command ",
                                                             &local_68);
                                              cmCommand::SetError(&this->super_cmCommand,&local_48);
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_48._M_dataplus._M_p != &local_48.field_2)
                                              {
                                                operator_delete(local_48._M_dataplus._M_p,
                                                                local_48.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                              bVar4 = false;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("must be called with at least two arguments.");
    return false;
    }
  std::string subCommand = args[0];
  if ( subCommand == "WRITE" )
    {
    return this->HandleWriteCommand(args, false);
    }
  else if ( subCommand == "APPEND" )
    {
    return this->HandleWriteCommand(args, true);
    }
  else if ( subCommand == "DOWNLOAD" )
    {
    return this->HandleDownloadCommand(args);
    }
  else if ( subCommand == "UPLOAD" )
    {
    return this->HandleUploadCommand(args);
    }
  else if ( subCommand == "READ" )
    {
    return this->HandleReadCommand(args);
    }
  else if ( subCommand == "MD5" ||
            subCommand == "SHA1" ||
            subCommand == "SHA224" ||
            subCommand == "SHA256" ||
            subCommand == "SHA384" ||
            subCommand == "SHA512" )
    {
    return this->HandleHashCommand(args);
    }
  else if ( subCommand == "STRINGS" )
    {
    return this->HandleStringsCommand(args);
    }
  else if ( subCommand == "GLOB" )
    {
    return this->HandleGlobCommand(args, false);
    }
  else if ( subCommand == "GLOB_RECURSE" )
    {
    return this->HandleGlobCommand(args, true);
    }
  else if ( subCommand == "MAKE_DIRECTORY" )
    {
    return this->HandleMakeDirectoryCommand(args);
    }
  else if ( subCommand == "RENAME" )
    {
    return this->HandleRename(args);
    }
  else if ( subCommand == "REMOVE" )
    {
    return this->HandleRemove(args, false);
    }
  else if ( subCommand == "REMOVE_RECURSE" )
    {
    return this->HandleRemove(args, true);
    }
  else if ( subCommand == "COPY" )
    {
    return this->HandleCopyCommand(args);
    }
  else if ( subCommand == "INSTALL" )
    {
    return this->HandleInstallCommand(args);
    }
  else if ( subCommand == "DIFFERENT" )
    {
    return this->HandleDifferentCommand(args);
    }
  else if ( subCommand == "RPATH_CHANGE" || subCommand == "CHRPATH" )
    {
    return this->HandleRPathChangeCommand(args);
    }
  else if ( subCommand == "RPATH_CHECK" )
    {
    return this->HandleRPathCheckCommand(args);
    }
  else if ( subCommand == "RPATH_REMOVE" )
    {
    return this->HandleRPathRemoveCommand(args);
    }
  else if ( subCommand == "RELATIVE_PATH" )
    {
    return this->HandleRelativePathCommand(args);
    }
  else if ( subCommand == "TO_CMAKE_PATH" )
    {
    return this->HandleCMakePathCommand(args, false);
    }
  else if ( subCommand == "TO_NATIVE_PATH" )
    {
    return this->HandleCMakePathCommand(args, true);
    }
  else if ( subCommand == "TIMESTAMP" )
    {
    return this->HandleTimestampCommand(args);
    }
  else if ( subCommand == "GENERATE" )
    {
    return this->HandleGenerateCommand(args);
    }
  else if ( subCommand == "LOCK" )
    {
    return this->HandleLockCommand(args);
    }

  std::string e = "does not recognize sub-command "+subCommand;
  this->SetError(e);
  return false;
}